

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O2

int mbedtls_cipher_cmac_finish(mbedtls_cipher_context_t *ctx,uchar *output)

{
  uchar *buf;
  mbedtls_cmac_context_t *r;
  ulong uVar1;
  int iVar2;
  size_t j;
  ulong uVar3;
  uchar *b;
  uchar *a;
  ulong n;
  size_t ilen;
  size_t local_78;
  size_t olen;
  uchar local_68 [8];
  uchar K2 [16];
  uchar K1 [16];
  uchar M_last [16];
  
  iVar2 = -0x6100;
  if (((ctx != (mbedtls_cipher_context_t *)0x0) &&
      (ctx->cipher_info != (mbedtls_cipher_info_t *)0x0)) &&
     (r = ctx->cmac_ctx, output != (uchar *)0x0 && r != (mbedtls_cmac_context_t *)0x0)) {
    n = (ulong)(*(uint *)&ctx->cipher_info->field_0x8 & 0x1f);
    olen = (size_t)output;
    mbedtls_platform_zeroize(K2 + 8,0x10);
    mbedtls_platform_zeroize(local_68,0x10);
    mbedtls_platform_zeroize(K1 + 8,0x10);
    if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
      ilen = 0;
    }
    else {
      ilen = (size_t)(*(uint *)&ctx->cipher_info->field_0x8 & 0x1f);
    }
    iVar2 = mbedtls_cipher_update(ctx,K1 + 8,ilen,K1 + 8,&local_78);
    if (iVar2 == 0) {
      iVar2 = cmac_multiply_by_u(K2 + 8,K1 + 8,ilen);
      if (iVar2 == 0) {
        cmac_multiply_by_u(local_68,K2 + 8,ilen);
      }
    }
    mbedtls_platform_zeroize(K1 + 8,0x10);
    buf = r->unprocessed_block;
    uVar1 = r->unprocessed_len;
    if (uVar1 < n) {
      for (uVar3 = 0; n != uVar3; uVar3 = uVar3 + 1) {
        if (uVar3 < uVar1) {
          K1[uVar3 + 8] = buf[uVar3];
        }
        else if (uVar3 == uVar1) {
          K1[uVar1 + 8] = 0x80;
        }
        else {
          K1[uVar3 + 8] = '\0';
        }
      }
      b = local_68;
      a = K1 + 8;
    }
    else {
      b = K2 + 8;
      a = buf;
    }
    mbedtls_xor(K1 + 8,a,b,n);
    mbedtls_xor(r->state,K1 + 8,r->state,n);
    iVar2 = mbedtls_cipher_update(ctx,r->state,n,r->state,&local_78);
    if (iVar2 == 0) {
      memcpy((void *)olen,r,n);
    }
    mbedtls_platform_zeroize(K2 + 8,0x10);
    mbedtls_platform_zeroize(local_68,0x10);
    r->unprocessed_len = 0;
    mbedtls_platform_zeroize(buf,0x10);
    mbedtls_platform_zeroize(r,0x10);
  }
  return iVar2;
}

Assistant:

int mbedtls_cipher_cmac_finish(mbedtls_cipher_context_t *ctx,
                               unsigned char *output)
{
    mbedtls_cmac_context_t *cmac_ctx;
    unsigned char *state, *last_block;
    unsigned char K1[MBEDTLS_CMAC_MAX_BLOCK_SIZE];
    unsigned char K2[MBEDTLS_CMAC_MAX_BLOCK_SIZE];
    unsigned char M_last[MBEDTLS_CMAC_MAX_BLOCK_SIZE];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t olen, block_size;

    if (ctx == NULL || ctx->cipher_info == NULL || ctx->cmac_ctx == NULL ||
        output == NULL) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    cmac_ctx = ctx->cmac_ctx;
    block_size = mbedtls_cipher_info_get_block_size(ctx->cipher_info);
    state = cmac_ctx->state;

    mbedtls_platform_zeroize(K1, sizeof(K1));
    mbedtls_platform_zeroize(K2, sizeof(K2));
    cmac_generate_subkeys(ctx, K1, K2);

    last_block = cmac_ctx->unprocessed_block;

    /* Calculate last block */
    if (cmac_ctx->unprocessed_len < block_size) {
        cmac_pad(M_last, block_size, last_block, cmac_ctx->unprocessed_len);
        mbedtls_xor(M_last, M_last, K2, block_size);
    } else {
        /* Last block is complete block */
        mbedtls_xor(M_last, last_block, K1, block_size);
    }


    mbedtls_xor(state, M_last, state, block_size);
    if ((ret = mbedtls_cipher_update(ctx, state, block_size, state,
                                     &olen)) != 0) {
        goto exit;
    }

    memcpy(output, state, block_size);

exit:
    /* Wipe the generated keys on the stack, and any other transients to avoid
     * side channel leakage */
    mbedtls_platform_zeroize(K1, sizeof(K1));
    mbedtls_platform_zeroize(K2, sizeof(K2));

    cmac_ctx->unprocessed_len = 0;
    mbedtls_platform_zeroize(cmac_ctx->unprocessed_block,
                             sizeof(cmac_ctx->unprocessed_block));

    mbedtls_platform_zeroize(state, MBEDTLS_CMAC_MAX_BLOCK_SIZE);
    return ret;
}